

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_bool(void)

{
  _Bool _Var1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Bool *p_Var5;
  bson_t *bcon;
  _Bool b;
  
  uVar3 = bson_bcon_magic();
  _Var1 = bcon_ensure_bool(true);
  uVar3 = bcon_new(0,"foo",uVar3,7,_Var1);
  uVar4 = bson_bcone_magic();
  p_Var5 = bcon_ensure_bool_ptr((_Bool *)((long)&bcon + 7));
  bVar2 = bcon_extract(uVar3,"foo",uVar4,7,p_Var5,0);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x6c,"test_bool","BCON_EXTRACT (bcon, \"foo\", BCONE_BOOL (b))");
    abort();
  }
  if ((bcon._7_1_ & 1) != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x6e,"test_bool","b == true");
    abort();
  }
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_bool (void)
{
   bool b;

   bson_t *bcon = BCON_NEW ("foo", BCON_BOOL (true));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_BOOL (b)));

   BSON_ASSERT (b == true);

   bson_destroy (bcon);
}